

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlist.c
# Opt level: O0

int main(void)

{
  rlist *prVar1;
  uint uVar2;
  int iVar3;
  rlist *prVar4;
  long lVar5;
  bool bVar6;
  bool local_464;
  bool local_463;
  bool local_450;
  bool local_44f;
  bool local_44e;
  bool local_44d;
  bool local_44c;
  bool local_44b;
  bool local_449;
  undefined1 local_378 [8];
  rlist empty_list;
  rlist *rlist;
  test *tmp;
  test *it;
  int i;
  rlist tmp_3;
  rlist tmp_2;
  rlist tmp_1;
  
  plan(0x68);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  local_449 = head.next == head.prev && head.next == &head;
  _ok((uint)local_449,"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x1a,
      "list is empty");
  for (it._0_4_ = 0; (int)(uint)it < 7; it._0_4_ = (uint)it + 1) {
    items[(int)(uint)it].no = (uint)it;
    lVar5 = (long)(int)(uint)it;
    prVar4 = &items[lVar5].list;
    items[lVar5].list.next = &head;
    prVar4->prev = head.prev;
    prVar4->prev->next = prVar4;
    (items[lVar5].list.next)->prev = prVar4;
  }
  local_378 = (undefined1  [8])local_378;
  empty_list.prev = (rlist *)local_378;
  _ok(1,"rlist_empty(&empty_list)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x20,
      "rlist_nil is empty");
  local_44b = head2.next == head2.prev && head2.next == &head2;
  _ok((uint)local_44b,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x21,
      "head2 is empty");
  prVar1 = head2.next;
  prVar4 = head2.prev;
  head2.prev = (rlist *)local_378;
  head2.next = empty_list.prev;
  local_378 = (undefined1  [8])prVar4;
  empty_list.prev = prVar1;
  if (prVar1 == &head2) {
    empty_list.prev = (rlist *)local_378;
  }
  (empty_list.prev)->prev = (rlist *)local_378;
  prVar4->next = (rlist *)local_378;
  if (head2.next == (rlist *)local_378) {
    head2.next = &head2;
  }
  (head2.next)->prev = &head2;
  (head2.prev)->next = &head2;
  local_44c = empty_list.prev == prVar4 && empty_list.prev == (rlist *)local_378;
  _ok((uint)local_44c,"rlist_empty(&empty_list)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x23,
      "rlist_nil is empty after swap");
  local_44d = head2.next == head2.prev && head2.next == &head2;
  _ok((uint)local_44d,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x24,
      "head2 is empty after swap");
  prVar1 = head.next;
  prVar4 = head.prev;
  head.prev = head2.prev;
  head.next = head2.next;
  head2.prev = prVar4;
  head2.next = prVar1;
  if (prVar1 == &head) {
    head2.next = &head2;
  }
  (head2.next)->prev = &head2;
  (head2.prev)->next = &head2;
  if (head.next == &head2) {
    head.next = &head;
  }
  (head.next)->prev = &head;
  (head.prev)->next = &head;
  local_44e = head.next == head.prev && head.next == &head;
  _ok((uint)local_44e,"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x26,
      "head is empty after swap");
  _ok((uint)(head2.next == &items[0].list),"rlist_first(&head2) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x27,
      "first item");
  _ok((uint)(head2.prev == &items[6].list),"rlist_last(&head2) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x28,
      "last item");
  it._0_4_ = 0;
  for (empty_list.next = head2.next; empty_list.next != &head2;
      empty_list.next = (empty_list.next)->next) {
    _ok((uint)(empty_list.next == &items[(int)(uint)it].list),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x2b,
        "element (foreach) %d",(ulong)(uint)it);
    it._0_4_ = (uint)it + 1;
  }
  for (empty_list.next = head2.prev; prVar1 = head2.next, prVar4 = head2.prev,
      empty_list.next != &head2; empty_list.next = (empty_list.next)->prev) {
    it._0_4_ = (uint)it - 1;
    _ok((uint)(empty_list.next == &items[(int)(uint)it].list),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x30,
        "element (foreach_reverse) %d",(ulong)(uint)it);
  }
  head2.prev = head.prev;
  head2.next = head.next;
  head.prev = prVar4;
  head.next = prVar1;
  if (prVar1 == &head2) {
    head.next = &head;
  }
  (head.next)->prev = &head;
  (head.prev)->next = &head;
  if (head2.next == &head) {
    head2.next = &head2;
  }
  (head2.next)->prev = &head2;
  (head2.prev)->next = &head2;
  _ok((uint)(head.next == &items[0].list),"rlist_first(&head) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x35,
      "first item");
  _ok((uint)(head.next != &items[6].list),"rlist_first(&head) != &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x36,
      "first item");
  _ok((uint)(head.prev == &items[6].list),"rlist_last(&head) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x38,
      "last item");
  _ok((uint)(head.prev != &items[0].list),"rlist_last(&head) != &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x39,
      "last item");
  _ok((uint)(head.next == &items[0].list),"rlist_next(&head) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x3b,
      "rlist_next");
  _ok((uint)(head.prev == &items[6].list),"rlist_prev(&head) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x3c,
      "rlist_prev");
  it._0_4_ = 0;
  for (empty_list.next = head.next; empty_list.next != &head;
      empty_list.next = (empty_list.next)->next) {
    _ok((uint)(empty_list.next == &items[(int)(uint)it].list),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x40,
        "element (foreach) %d",(ulong)(uint)it);
    it._0_4_ = (uint)it + 1;
  }
  for (empty_list.next = head.prev; empty_list.next != &head;
      empty_list.next = (empty_list.next)->prev) {
    it._0_4_ = (uint)it - 1;
    _ok((uint)(empty_list.next == &items[(int)(uint)it].list),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x45,
        "element (foreach_reverse) %d",(ulong)(uint)it);
  }
  _ok(1,"rlist_entry(&items[0].list, struct test, list) == &items[0]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4a,
      "rlist_entry");
  _ok((uint)(head.next == &items[0].list),"rlist_first_entry(&head, struct test, list) == &items[0]"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4c,
      "rlist_first_entry");
  _ok((uint)(items[0].list.next == &items[1].list),"rlist_next_entry(&items[0], list) == &items[1]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4d,
      "rlist_next_entry");
  _ok((uint)(items[2].list.prev == &items[1].list),"rlist_prev_entry(&items[2], list) == &items[1]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4e,
      "rlist_prev_entry");
  it._0_4_ = 0;
  for (prVar4 = head.next; tmp = (test *)&prVar4[-1].next, prVar1 = head.prev,
      tmp != (test *)&__dso_handle; prVar4 = prVar4->next) {
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x53,
        "element (foreach_entry) %d",(ulong)(uint)it);
    it._0_4_ = (uint)it + 1;
  }
  for (; tmp = (test *)&prVar1[-1].next, tmp != (test *)&__dso_handle; prVar1 = prVar1->prev) {
    it._0_4_ = (uint)it - 1;
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x58,
        "element (foreach_entry_reverse) %d",(ulong)(uint)it);
  }
  (items[2].list.prev)->next = items[2].list.next;
  (items[2].list.next)->prev = items[2].list.prev;
  items[2].list.next = &items[2].list;
  items[2].list.prev = &items[2].list;
  local_44f = head2.next == head2.prev && head2.next == &head2;
  _ok((uint)local_44f,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x5c,
      "head2 is empty");
  (items[3].list.prev)->next = items[3].list.next;
  (items[3].list.next)->prev = items[3].list.prev;
  prVar4 = head2.next;
  items[3].list.prev = &head2;
  items[3].list.next = head2.next;
  head2.next = &items[3].list;
  prVar4->prev = (rlist *)0x1060d0;
  local_450 = head2.next == head2.prev && head2.next == &head2;
  _ok((uint)((local_450 ^ 0xffU) & 1),"!rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x5e,
      "head2 isnt empty");
  _ok((uint)(head2.next == &items[3].list),
      "rlist_first_entry(&head2, struct test, list) == &items[3]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x60,
      "Item was moved");
  (items[4].list.prev)->next = items[4].list.next;
  (items[4].list.next)->prev = items[4].list.prev;
  items[4].list.next = &head2;
  items[4].list.prev = head2.prev;
  (head2.prev)->next = &items[4].list;
  (items[4].list.next)->prev = (rlist *)0x1060e8;
  for (prVar4 = head.next; tmp = (test *)&prVar4[-1].next, prVar1 = head.prev,
      tmp != (test *)&__dso_handle; prVar4 = prVar4->next) {
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",99,
        "element (second deleted) %d",(ulong)(uint)it);
    uVar2 = (uint)it + 1;
    if ((uint)it + 1 == 2) {
      uVar2 = (uint)it + 4;
    }
    it._0_4_ = uVar2;
  }
  for (; tmp = (test *)&prVar1[-1].next, tmp != (test *)&__dso_handle; prVar1 = prVar1->prev) {
    uVar2 = (uint)it - 1;
    if ((uint)it - 1 == 4) {
      uVar2 = (uint)it - 4;
    }
    it._0_4_ = uVar2;
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x6c,
        "element (second deleted) %d",(ulong)(uint)it);
  }
  head.next = &head;
  head.prev = &head;
  _ok(1,"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x71,
      "list is empty");
  for (it._0_4_ = 0; (int)(uint)it < 7; it._0_4_ = (uint)it + 1) {
    items[(int)(uint)it].no = (uint)it;
    lVar5 = (long)(int)(uint)it;
    prVar4 = &items[lVar5].list;
    prVar4->prev = &head;
    items[lVar5].list.next = head.next;
    prVar4->prev->next = prVar4;
    (items[lVar5].list.next)->prev = prVar4;
  }
  it._0_4_ = 0;
  for (prVar4 = head.prev; tmp = (test *)&prVar4[-1].next, prVar1 = head.next,
      tmp != (test *)&__dso_handle; prVar4 = prVar4->prev) {
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x78,
        "element (foreach_entry_reverse) %d",(ulong)(uint)it);
    it._0_4_ = (uint)it + 1;
  }
  for (; tmp = (test *)&prVar1[-1].next, tmp != (test *)&__dso_handle; prVar1 = prVar1->next) {
    it._0_4_ = (uint)it - 1;
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x7d,
        "element (foreach_entry) %d",(ulong)(uint)it);
  }
  items[0].list.prev = &head;
  items[0].list.next = &head;
  head.next = &items[0].list;
  head.prev = &items[0].list;
  _ok(1,"rlist_prev_entry_safe(&items[0], &head, list) == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x82,
      "prev is null");
  head.next = &head;
  head.prev = &head;
  it._0_4_ = 0;
  tmp = (test *)&__dso_handle;
  while( true ) {
    bVar6 = false;
    if (tmp != (test *)&__dso_handle) {
      rlist = (rlist *)&(tmp->list).prev[-1].next;
      bVar6 = rlist != (rlist *)0x0;
    }
    if (!bVar6) break;
    it._0_4_ = (uint)it + 1;
    tmp = (test *)rlist;
  }
  _ok((uint)((uint)it == 0),"i == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x88,
      "list is empty");
  for (it._0_4_ = 0; (int)(uint)it < 7; it._0_4_ = (uint)it + 1) {
    items[(int)(uint)it].no = (uint)it;
    lVar5 = (long)(int)(uint)it;
    prVar4 = &items[lVar5].list;
    prVar4->prev = &head;
    items[lVar5].list.next = head.next;
    prVar4->prev->next = prVar4;
    (items[lVar5].list.next)->prev = prVar4;
  }
  it._0_4_ = 0;
  tmp = (test *)&head.prev[-1].next;
  while( true ) {
    prVar4 = head.next;
    bVar6 = false;
    if (tmp != (test *)&__dso_handle) {
      rlist = (rlist *)&(tmp->list).prev[-1].next;
      bVar6 = rlist != (rlist *)0x0;
    }
    if (!bVar6) break;
    prVar4 = &tmp->list;
    prVar4->prev->next = (tmp->list).next;
    ((tmp->list).next)->prev = prVar4->prev;
    (tmp->list).next = prVar4;
    prVar4->prev = prVar4;
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x90,
        "element (reverse) %d",(ulong)(uint)it);
    it._0_4_ = (uint)it + 1;
    tmp = (test *)rlist;
  }
  items[0].list.prev = &head;
  items[0].list.next = head.next;
  head.next = &items[0].list;
  prVar4->prev = (rlist *)0x106088;
  if (head2.next == head.next) {
    head2.next = &head2;
    head2.prev = &head2;
  }
  else {
    head2.next = head.next;
    (head.next)->prev = &head2;
    head2.prev = (head.next)->prev;
    (head2.prev)->next = &head2;
    (head.next)->prev = &head;
  }
  local_463 = head2.next == head2.prev && head2.next == &head2;
  _ok((uint)local_463,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x95,
      "list is empty");
  for (it._0_4_ = 1; (int)(uint)it < 7; it._0_4_ = (uint)it + 1) {
    items[(int)(uint)it].no = (uint)it;
    lVar5 = (long)(int)(uint)it;
    prVar4 = &items[lVar5].list;
    items[lVar5].list.next = &head;
    prVar4->prev = head.prev;
    prVar4->prev->next = prVar4;
    (items[lVar5].list.next)->prev = prVar4;
  }
  if (head2.next == head.next) {
    head2.next = &head2;
    head2.prev = &head2;
  }
  else {
    head2.next = head.next;
    (head.next)->prev = &head2;
    head2.prev = (head.next)->prev;
    (head2.prev)->next = &head2;
    (head.next)->prev = &head;
  }
  local_464 = head2.next == head2.prev && head2.next == &head2;
  _ok((uint)local_464,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x9b,
      "list is empty");
  if (head2.next == &items[3].list) {
    head2.next = &head2;
    head2.prev = &head2;
  }
  else {
    head2.next = head.next;
    (head.next)->prev = &head2;
    head2.prev = items[3].list.prev;
    (items[3].list.prev)->next = &head2;
    head.next = &items[3].list;
    items[3].list.prev = &head;
  }
  it._0_4_ = 0;
  for (prVar4 = head2.next; tmp = (test *)&prVar4[-1].next, prVar1 = head.next,
      tmp != (test *)&head.next; prVar4 = prVar4->next) {
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x9f,
        "element (first half) %d",(ulong)(uint)it);
    it._0_4_ = (uint)it + 1;
  }
  for (; tmp = (test *)&prVar1[-1].next, tmp != (test *)&__dso_handle; prVar1 = prVar1->next) {
    _ok((uint)(tmp == items + (int)(uint)it),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0xa3,
        "element (second half) %d",(ulong)(uint)it);
    it._0_4_ = (uint)it + 1;
  }
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar3 = check_plan();
  return iVar3;
}

Assistant:

int
main(void)
{
	int i;
	struct test *it, *tmp;
	struct rlist *rlist;

	plan(104);
	header();

	ok(rlist_empty(&head), "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add_tail(&head, &(items[i].list));
	}
	RLIST_HEAD(empty_list);
	ok(rlist_empty(&empty_list), "rlist_nil is empty");
	ok(rlist_empty(&head2), "head2 is empty");
	rlist_swap(&head2, &empty_list);
	ok(rlist_empty(&empty_list), "rlist_nil is empty after swap");
	ok(rlist_empty(&head2), "head2 is empty after swap");
	rlist_swap(&head, &head2);
	ok(rlist_empty(&head), "head is empty after swap");
	is(rlist_first(&head2), &items[0].list, "first item");
	is(rlist_last(&head2), &items[ITEMS - 1].list, "last item");
	i = 0;
	rlist_foreach(rlist, &head2) {
		is(rlist, &items[i].list, "element (foreach) %d", i);
		i++;
	}
	rlist_foreach_reverse(rlist, &head2) {
		i--;
		is(rlist, &items[i].list, "element (foreach_reverse) %d", i);
	}
	rlist_swap(&head2, &head);


	is(rlist_first(&head), &items[0].list, "first item");
	isnt(rlist_first(&head), &items[ITEMS - 1].list, "first item");

	is(rlist_last(&head), &items[ITEMS - 1].list, "last item");
	isnt(rlist_last(&head), &items[0].list, "last item");

	is(rlist_next(&head), &items[0].list, "rlist_next");
	is(rlist_prev(&head), &items[ITEMS - 1].list, "rlist_prev");

	i = 0;
	rlist_foreach(rlist, &head) {
		is(rlist, &items[i].list, "element (foreach) %d", i);
		i++;
	}
	rlist_foreach_reverse(rlist, &head) {
		i--;
		is(rlist, &items[i].list, "element (foreach_reverse) %d", i);
	}


	is(rlist_entry(&items[0].list, struct test, list), &items[0],
		"rlist_entry");
	is(rlist_first_entry(&head, struct test, list), &items[0],
		"rlist_first_entry");
	is(rlist_next_entry(&items[0], list), &items[1], "rlist_next_entry");
	is(rlist_prev_entry(&items[2], list), &items[1], "rlist_prev_entry");


	i = 0;
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (foreach_entry) %d", i);
		i++;
	}
	rlist_foreach_entry_reverse(it, &head, list) {
		i--;
		is(it, items + i, "element (foreach_entry_reverse) %d", i);
	}

	rlist_del(&items[2].list);
	ok(rlist_empty(&head2), "head2 is empty");
	rlist_move(&head2, &items[3].list);
	ok(!rlist_empty(&head2), "head2 isnt empty");
	is(rlist_first_entry(&head2, struct test, list),
					&items[3], "Item was moved");
	rlist_move_tail(&head2, &items[4].list);
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (second deleted) %d", i);
		i++;
		if (i == 2)
			i += 3;
	}
	rlist_foreach_entry_reverse(it, &head, list) {
		i--;
		if (i == 4)
			i -= 3;
		is(it, items + i, "element (second deleted) %d", i);
	}


	rlist_create(&head);
	ok(rlist_empty(&head), "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add(&head, &(items[i].list));
	}
	i = 0;
	rlist_foreach_entry_reverse(it, &head, list) {
		is(it, items + i, "element (foreach_entry_reverse) %d", i);
		i++;
	}
	rlist_foreach_entry(it, &head, list) {
		i--;
		is(it, items + i, "element (foreach_entry) %d", i);
	}
	rlist_create(&head);
	rlist_add_entry(&head, &items[0], list);
	ok(rlist_prev_entry_safe(&items[0], &head, list) == NULL,
	   "prev is null");

	rlist_create(&head);
	i = 0;
	rlist_foreach_entry_safe_reverse(it, &head, list, tmp)
		++i;
	ok(i == 0, "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add(&head, &(items[i].list));
	}
	i = 0;
	rlist_foreach_entry_safe_reverse(it, &head, list, tmp) {
		rlist_del_entry(it, list);
		is(it, items + i, "element (reverse) %d", i);
		i++;
	}
	rlist_add(&head, &items[0].list);
	rlist_cut_before(&head2, &head, head.next);
	ok(rlist_empty(&head2), "list is empty");
	for (i = 1; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add_tail(&head, &(items[i].list));
	}
	rlist_cut_before(&head2, &head, head.next);
	ok(rlist_empty(&head2), "list is empty");
	rlist_cut_before(&head2, &head, &items[ITEMS / 2].list);
	i = 0;
	rlist_foreach_entry(it, &head2, list) {
		is(it, items + i, "element (first half) %d", i);
		i++;
	}
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (second half) %d", i);
		i++;
	}

	footer();
	return check_plan();
}